

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cc
# Opt level: O0

void __thiscall Filter::set_Q(Filter *this)

{
  Filter *this_local;
  
  this->_1024_div_Q = (int)(1024.0 / (((double)this->res * 1.0) / 15.0 + 0.707));
  return;
}

Assistant:

void Filter::set_Q()
{
  // Q is controlled linearly by res. Q has approximate range [0.707, 1.7].
  // As resonance is increased, the filter must be clocked more often to keep
  // stable.

  // The coefficient 1024 is dispensed of later by right-shifting 10 times
  // (2 ^ 10 = 1024).
  _1024_div_Q = static_cast<sound_sample>(1024.0/(0.707 + 1.0*res/0x0f));
}